

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t encoder_qp_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  int iVar5;
  size_t sVar6;
  undefined7 in_register_00000011;
  size_t sVar7;
  ulong uVar8;
  size_t n;
  ulong uVar9;
  char buf [4];
  char cStack_51;
  undefined4 local_50;
  int local_4c;
  size_t local_48;
  mime_encoder_state *local_40;
  size_t local_38;
  
  local_4c = (int)CONCAT71(in_register_00000011,ateof);
  local_40 = &part->encstate;
  local_48 = 0;
  do {
    uVar4 = local_50;
    uVar8 = (part->encstate).bufbeg;
    if ((part->encstate).bufend <= uVar8) goto LAB_004b0c94;
    bVar2 = (part->encstate).buf[uVar8];
    bVar3 = ""[bVar2];
    uVar8 = (ulong)bVar3;
    local_50._0_2_ = CONCAT11("0123456789ABCDEF"[bVar2 >> 4],bVar2);
    local_50._3_1_ = SUB41(uVar4,3);
    local_50._0_3_ = CONCAT12("0123456789ABCDEF"[bVar2 & 0xf],(undefined2)local_50);
    n = uVar8;
    if (bVar3 == 1) {
LAB_004b0bbd:
      if ((&cStack_51)[uVar8] != '\n') {
        uVar9 = local_40->pos + uVar8;
        if (uVar9 == 0x4c) {
          iVar5 = qp_lookahead_eol(local_40,local_4c,n);
          if (iVar5 == -1) goto LAB_004b0c67;
          if (iVar5 != 0) goto LAB_004b0bf4;
        }
        else {
LAB_004b0bf4:
          if (uVar9 < 0x4d) goto LAB_004b0c0a;
        }
        local_50 = 0xa0d3d;
        uVar8 = 3;
        n = 0;
      }
LAB_004b0c0a:
      iVar5 = 3;
      if (uVar8 <= size) {
        memcpy(buffer,&local_50,uVar8);
        local_48 = local_48 + uVar8;
        buffer = buffer + uVar8;
        sVar6 = (part->encstate).pos + uVar8;
        (part->encstate).pos = sVar6;
        iVar5 = 0;
        sVar7 = 0;
        if (*(char *)((uVar8 - 1) + (long)&local_50) != '\n') {
          sVar7 = sVar6;
        }
        (part->encstate).pos = sVar7;
        psVar1 = &(part->encstate).bufbeg;
        *psVar1 = *psVar1 + n;
        size = size - uVar8;
      }
    }
    else {
      if (bVar3 != 3) {
        if (bVar3 == 2) {
          iVar5 = qp_lookahead_eol(local_40,local_4c,1);
          if (iVar5 == -1) goto LAB_004b0c67;
          if (iVar5 == 0) {
            uVar8 = 1;
            n = 1;
            goto LAB_004b0bbd;
          }
        }
        else {
LAB_004b0ba8:
        }
        local_50 = CONCAT31(local_50._1_3_,0x3d);
        uVar8 = 3;
        n = 1;
        goto LAB_004b0bbd;
      }
      iVar5 = qp_lookahead_eol(local_40,local_4c,0);
      if (iVar5 != -1) {
        if (iVar5 != 1) goto LAB_004b0ba8;
        local_50._0_2_ = CONCAT11(10,(undefined1)local_50);
        uVar8 = 2;
        n = 2;
        goto LAB_004b0bbd;
      }
LAB_004b0c67:
      iVar5 = 1;
      local_38 = local_48;
    }
  } while (iVar5 == 0);
  if (iVar5 == 3) {
LAB_004b0c94:
    local_38 = local_48;
  }
  return local_38;
}

Assistant:

static size_t encoder_qp_read(char *buffer, size_t size, bool ateof,
                              curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  char *ptr = buffer;
  size_t cursize = 0;
  int softlinebreak;
  char buf[4];

  /* On all platforms, input is supposed to be ASCII compatible: for this
     reason, we use hexadecimal ASCII codes in this function rather than
     character constants that can be interpreted as non-ascii on some
     platforms. Preserve ASCII encoding on output too. */
  while(st->bufbeg < st->bufend) {
    size_t len = 1;
    size_t consumed = 1;
    int i = st->buf[st->bufbeg];
    buf[0] = (char) i;
    buf[1] = aschex[(i >> 4) & 0xF];
    buf[2] = aschex[i & 0xF];

    switch(qp_class[st->buf[st->bufbeg] & 0xFF]) {
    case QP_OK:          /* Not a special character. */
      break;
    case QP_SP:          /* Space or tab. */
      /* Spacing must be escaped if followed by CRLF. */
      switch(qp_lookahead_eol(st, ateof, 1)) {
      case -1:          /* More input data needed. */
        return cursize;
      case 0:           /* No encoding needed. */
        break;
      default:          /* CRLF after space or tab. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    case QP_CR:         /* Carriage return. */
      /* If followed by a line-feed, output the CRLF pair.
         Else escape it. */
      switch(qp_lookahead_eol(st, ateof, 0)) {
      case -1:          /* Need more data. */
        return cursize;
      case 1:           /* CRLF found. */
        buf[len++] = '\x0A';    /* Append '\n'. */
        consumed = 2;
        break;
      default:          /* Not followed by LF: escape. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    default:            /* Character must be escaped. */
      buf[0] = '\x3D';    /* '=' */
      len = 3;
      break;
    }

    /* Be sure the encoded character fits within maximum line length. */
    if(buf[len - 1] != '\x0A') {    /* '\n' */
      softlinebreak = st->pos + len > MAX_ENCODED_LINE_LENGTH;
      if(!softlinebreak && st->pos + len == MAX_ENCODED_LINE_LENGTH) {
        /* We may use the current line only if end of data or followed by
           a CRLF. */
        switch(qp_lookahead_eol(st, ateof, consumed)) {
        case -1:        /* Need more data. */
          return cursize;
          break;
        case 0:         /* Not followed by a CRLF. */
          softlinebreak = 1;
          break;
        }
      }
      if(softlinebreak) {
        strcpy(buf, "\x3D\x0D\x0A");    /* "=\r\n" */
        len = 3;
        consumed = 0;
      }
    }

    /* If the output buffer would overflow, do not store. */
    if(len > size)
      break;

    /* Append to output buffer. */
    memcpy(ptr, buf, len);
    cursize += len;
    ptr += len;
    size -= len;
    st->pos += len;
    if(buf[len - 1] == '\x0A')    /* '\n' */
      st->pos = 0;
    st->bufbeg += consumed;
  }

  return cursize;
}